

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

bool __thiscall LinearGE<0,_0>::propagate(LinearGE<0,_0> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  IntVar *pIVar4;
  Lit *pLVar5;
  long *plVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  Clause *pCVar10;
  IntView<0> *pIVar11;
  IntView<1> *pIVar12;
  vec<Lit> *pvVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  int64_t iVar18;
  bool bVar19;
  Clause *local_50;
  vec<Lit> *local_48;
  ulong local_40;
  vec<Lit> *local_38;
  
  iVar18 = this->fix_sum;
  uVar1 = (this->x).sz;
  uVar2 = this->fix_x;
  uVar14 = (ulong)uVar2;
  if (uVar2 < uVar1) {
    pIVar11 = (this->x).data + uVar14;
    lVar9 = uVar1 - uVar14;
    do {
      iVar18 = iVar18 + (pIVar11->var->max).v;
      pIVar11 = pIVar11 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  uVar1 = (this->y).sz;
  uVar3 = this->fix_y;
  if (uVar3 < uVar1) {
    lVar9 = (ulong)uVar1 - (ulong)uVar3;
    pIVar12 = (this->y).data + uVar3;
    do {
      iVar18 = iVar18 - (pIVar12->var->min).v;
      pIVar12 = pIVar12 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  if (uVar2 < (this->x).sz) {
    local_48 = &this->ps;
    do {
      pIVar4 = (this->x).data[uVar14].var;
      uVar15 = (pIVar4->max).v - iVar18;
      if ((long)(pIVar4->min).v < (long)uVar15) {
        if (so.lazy == true) {
          local_40 = uVar15;
          if ((this->x).sz != 0) {
            lVar9 = 0;
            uVar15 = 0;
            do {
              iVar8 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar9) + 0x48))();
              (this->ps).data[uVar15].x = iVar8;
              uVar15 = uVar15 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar15 < (this->x).sz);
          }
          if ((this->y).sz != 0) {
            lVar9 = 0;
            uVar15 = 0;
            do {
              iVar8 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar9) + 0x40))();
              (this->ps).data[(this->x).sz + (int)uVar15].x = iVar8;
              uVar15 = uVar15 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar15 < (this->y).sz);
          }
          pLVar5 = (this->ps).data;
          pLVar5[uVar14].x = pLVar5->x;
          uVar1 = (this->ps).sz;
          sVar16 = (ulong)(uVar1 - 1) * 4 + 8;
          if (uVar1 == 0) {
            sVar16 = 8;
          }
          pCVar10 = (Clause *)malloc(sVar16);
          Clause::Clause<vec<Lit>>(pCVar10,local_48,false);
          *(byte *)pCVar10 = *(byte *)pCVar10 | 2;
          local_50 = pCVar10;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_50);
          pCVar10 = local_50;
          uVar15 = local_40;
        }
        else {
          pCVar10 = (Clause *)0x0;
        }
        pIVar4 = (this->x).data[uVar14].var;
        iVar8 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xe])(pIVar4,uVar15,pCVar10,1)
        ;
        if ((char)iVar8 == '\0') {
          uVar14 = 0;
          goto LAB_001ab6e8;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (this->x).sz);
  }
  uVar1 = this->fix_y;
  uVar15 = (ulong)uVar1;
  bVar19 = (this->y).sz <= uVar1;
  uVar14 = CONCAT71((int7)(uVar14 >> 8),bVar19);
  if (!bVar19) {
    local_38 = &this->ps;
    do {
      pvVar13 = (vec<Lit> *)(uVar15 * 0x10);
      pIVar4 = (this->y).data[uVar15].var;
      lVar17 = (pIVar4->min).v + iVar18;
      lVar9 = (long)(pIVar4->max).v;
      if (lVar9 != lVar17 && SBORROW8(-lVar17,-lVar9) == -lVar17 + lVar9 < 0) {
        if (so.lazy == true) {
          local_40 = CONCAT44(local_40._4_4_,(int)uVar14);
          local_48 = pvVar13;
          if ((this->x).sz != 0) {
            lVar9 = 0;
            uVar14 = 0;
            do {
              iVar8 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar9) + 0x48))();
              (this->ps).data[uVar14].x = iVar8;
              uVar14 = uVar14 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar14 < (this->x).sz);
          }
          if ((this->y).sz != 0) {
            lVar9 = 0;
            uVar14 = 0;
            do {
              iVar8 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar9) + 0x40))();
              (this->ps).data[(this->x).sz + (int)uVar14].x = iVar8;
              uVar14 = uVar14 + 1;
              lVar9 = lVar9 + 0x10;
            } while (uVar14 < (this->y).sz);
          }
          pLVar5 = (this->ps).data;
          pLVar5[(this->x).sz + (int)uVar15].x = pLVar5->x;
          uVar1 = (this->ps).sz;
          sVar16 = (ulong)(uVar1 - 1) * 4 + 8;
          if (uVar1 == 0) {
            sVar16 = 8;
          }
          pCVar10 = (Clause *)malloc(sVar16);
          Clause::Clause<vec<Lit>>(pCVar10,local_38,false);
          *(byte *)pCVar10 = *(byte *)pCVar10 | 2;
          local_50 = pCVar10;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_50);
          uVar14 = local_40 & 0xffffffff;
          pvVar13 = local_48;
          pCVar10 = local_50;
        }
        else {
          pCVar10 = (Clause *)0x0;
        }
        plVar6 = *(long **)((long)&pvVar13->sz + (long)&((this->y).data)->var);
        cVar7 = (**(code **)(*plVar6 + 0x78))(plVar6,lVar17,pCVar10,1);
        if (cVar7 == '\0') break;
      }
      uVar15 = uVar15 + 1;
      bVar19 = uVar15 < (this->y).sz;
      uVar14 = CONCAT71((int7)(uVar14 >> 8),!bVar19);
    } while (bVar19);
  }
LAB_001ab6e8:
  return (bool)((byte)uVar14 & 1);
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}